

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
exr_write_deep_scanline_chunk
          (exr_context_t ctxt,int part_index,int y,void *packed_data,uint64_t packed_size,
          uint64_t unpacked_size,void *sample_data,uint64_t sample_data_size)

{
  uint in_ESI;
  _internal_exr_context *in_RDI;
  int unaff_retaddr;
  _internal_exr_part *in_stack_00000008;
  int in_stack_00000014;
  _internal_exr_context *in_stack_00000018;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  uint64_t in_stack_00000030;
  exr_result_t rv;
  _internal_exr_context *packed_size_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar1;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar1 = 2;
  }
  else {
    packed_size_00 = in_RDI;
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      eVar1 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else if (in_RDI->parts[(int)in_ESI]->storage_mode == EXR_STORAGE_SCANLINE) {
      internal_exr_unlock(in_RDI);
      eVar1 = (*in_RDI->standard_error)(in_RDI,0x1c);
    }
    else {
      eVar1 = write_scan_chunk(in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,
                               (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                               ,(uint64_t)packed_size_00,in_stack_00000030,(void *)unpacked_size,
                               packed_size);
      internal_exr_unlock(in_RDI);
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_write_deep_scanline_chunk (
    exr_context_t ctxt,
    int           part_index,
    int           y,
    const void*   packed_data,
    uint64_t      packed_size,
    uint64_t      unpacked_size,
    const void*   sample_data,
    uint64_t      sample_data_size)
{
    exr_result_t rv;
    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (part->storage_mode == EXR_STORAGE_SCANLINE)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_USE_SCAN_NONDEEP_WRITE));

    rv = write_scan_chunk (
        pctxt,
        part_index,
        part,
        y,
        packed_data,
        packed_size,
        unpacked_size,
        sample_data,
        sample_data_size);
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}